

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::DynamicMapField::SyncMapWithRepeatedFieldNoLock(DynamicMapField *this)

{
  RepeatedPtrField<google::protobuf::Message> *pRVar1;
  Rep *pRVar2;
  bool bVar3;
  string sVar4;
  int iVar5;
  uint32 uVar6;
  undefined4 extraout_var;
  FieldDescriptor *field;
  undefined4 extraout_var_00;
  FieldDescriptor *field_00;
  LogMessage *other;
  KeyValue KVar7;
  MapValueRef *pMVar8;
  Message *pMVar9;
  undefined4 extraout_var_01;
  double dVar10;
  string *this_00;
  Reflection *this_01;
  void **ppvVar11;
  void **ppvVar12;
  float fVar13;
  iterator iter;
  FieldDescriptor *local_a0;
  DynamicMapField *local_98;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80 [2];
  KeyValue local_58;
  InnerMap *pIStack_50;
  size_type local_48;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *local_38;
  
  (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
  local_98 = this;
  iVar5 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
  local_90._0_8_ = local_90 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"key","");
  field = Descriptor::FindFieldByName((Descriptor *)CONCAT44(extraout_var,iVar5),(string *)local_90)
  ;
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_);
  }
  iVar5 = (*(local_98->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
  local_90._0_8_ = local_90 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"value","");
  field_00 = Descriptor::FindFieldByName
                       ((Descriptor *)CONCAT44(extraout_var_00,iVar5),(string *)local_90);
  if ((string *)local_90._0_8_ != (string *)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_);
  }
  local_38 = &local_98->map_;
  local_90._8_8_ = (local_98->map_).elements_;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  ::SearchFrom((iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                *)local_90,((InnerMap *)local_90._8_8_)->index_of_first_non_null_);
  local_48 = local_80[0]._M_allocated_capacity;
  local_58.string_value_ = (string *)local_90._0_8_;
  pIStack_50 = (InnerMap *)local_90._8_8_;
  if ((string *)local_90._0_8_ != (string *)0x0) {
    do {
      MapValueRef::DeleteData
                ((MapValueRef *)(((local_58.string_value_)->field_2)._M_allocated_capacity + 0x10));
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
      iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
      ::operator++((iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                    *)&local_58);
    } while (local_58.string_value_ != (string *)0x0);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(local_38);
  pRVar1 = (local_98->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.repeated_field_;
  pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
  ppvVar12 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar12 = (void **)0x0;
  }
  if (((long)(pRVar1->super_RepeatedPtrFieldBase).current_size_ & 0x1fffffffffffffffU) != 0) {
    do {
      pIStack_50 = (InnerMap *)((ulong)pIStack_50 & 0xffffffff00000000);
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_90._0_8_ = FieldDescriptor::TypeOnceInit;
        local_a0 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_90,
                   &local_a0);
      }
      switch(*(undefined4 *)
              (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
      case 1:
        uVar6 = Reflection::GetInt32(this_01,(Message *)*ppvVar12,field);
        MapKey::SetType((MapKey *)&local_58,CPPTYPE_INT32);
        goto LAB_002986b9;
      case 2:
        KVar7.int64_value_ = Reflection::GetInt64(this_01,(Message *)*ppvVar12,field);
        MapKey::SetType((MapKey *)&local_58,CPPTYPE_INT64);
        local_58.int64_value_ = KVar7.int64_value_;
        break;
      case 3:
        uVar6 = Reflection::GetUInt32(this_01,(Message *)*ppvVar12,field);
        MapKey::SetType((MapKey *)&local_58,CPPTYPE_UINT32);
LAB_002986b9:
        local_58.uint32_value_ = uVar6;
        break;
      case 4:
        KVar7.uint64_value_ = Reflection::GetUInt64(this_01,(Message *)*ppvVar12,field);
        MapKey::SetType((MapKey *)&local_58,CPPTYPE_UINT64);
        local_58.uint64_value_ = KVar7.uint64_value_;
        break;
      case 5:
      case 6:
      case 8:
      case 10:
        LogMessage::LogMessage
                  ((LogMessage *)local_90,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/map_field.cc"
                   ,0x1e4);
        other = LogMessage::operator<<((LogMessage *)local_90,"Can\'t get here.");
        LogFinisher::operator=((LogFinisher *)&local_a0,other);
        LogMessage::~LogMessage((LogMessage *)local_90);
        break;
      case 7:
        bVar3 = Reflection::GetBool(this_01,(Message *)*ppvVar12,field);
        MapKey::SetType((MapKey *)&local_58,CPPTYPE_BOOL);
        local_58.bool_value_ = bVar3;
        break;
      case 9:
        Reflection::GetString_abi_cxx11_((string *)local_90,this_01,(Message *)*ppvVar12,field);
        MapKey::SetType((MapKey *)&local_58,CPPTYPE_STRING);
        std::__cxx11::string::_M_assign((string *)local_58.string_value_);
        if ((string *)local_90._0_8_ != (string *)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_);
        }
      }
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::FindHelper
                ((pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
                  *)local_90,(local_98->map_).elements_,(MapKey *)&local_58,(TreeIterator *)0x0);
      if ((string *)local_90._0_8_ != (string *)0x0) {
        MapValueRef::DeleteData((MapValueRef *)(*(long *)(local_90._0_8_ + 0x10) + 0x10));
      }
      pMVar8 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                         (local_38,(key_type *)&local_58);
      if (*(once_flag **)(field_00 + 0x30) != (once_flag *)0x0) {
        local_90._0_8_ = FieldDescriptor::TypeOnceInit;
        local_a0 = field_00;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field_00 + 0x30),(_func_void_FieldDescriptor_ptr **)local_90,
                   &local_a0);
      }
      pMVar8->type_ =
           *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field_00 + 0x38) * 4);
      if (*(once_flag **)(field_00 + 0x30) != (once_flag *)0x0) {
        local_90._0_8_ = FieldDescriptor::TypeOnceInit;
        local_a0 = field_00;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field_00 + 0x30),(_func_void_FieldDescriptor_ptr **)local_90,
                   &local_a0);
      }
      switch(*(undefined4 *)
              (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field_00 + 0x38) * 4)) {
      case 1:
        this_00 = (string *)operator_new(4);
        uVar6 = Reflection::GetInt32(this_01,(Message *)*ppvVar12,field_00);
        goto LAB_002988c5;
      case 2:
        this_00 = (string *)operator_new(8);
        dVar10 = (double)Reflection::GetInt64(this_01,(Message *)*ppvVar12,field_00);
        goto LAB_002988ec;
      case 3:
        this_00 = (string *)operator_new(4);
        uVar6 = Reflection::GetUInt32(this_01,(Message *)*ppvVar12,field_00);
        goto LAB_002988c5;
      case 4:
        this_00 = (string *)operator_new(8);
        dVar10 = (double)Reflection::GetUInt64(this_01,(Message *)*ppvVar12,field_00);
LAB_002988ec:
        *(double *)this_00 = dVar10;
        break;
      case 5:
        this_00 = (string *)operator_new(8);
        dVar10 = Reflection::GetDouble(this_01,(Message *)*ppvVar12,field_00);
        *(double *)this_00 = dVar10;
        break;
      case 6:
        this_00 = (string *)operator_new(4);
        fVar13 = Reflection::GetFloat(this_01,(Message *)*ppvVar12,field_00);
        *(float *)this_00 = fVar13;
        break;
      case 7:
        this_00 = (string *)operator_new(1);
        sVar4 = (string)Reflection::GetBool(this_01,(Message *)*ppvVar12,field_00);
        *this_00 = sVar4;
        break;
      case 8:
        this_00 = (string *)operator_new(4);
        uVar6 = Reflection::GetEnumValue(this_01,(Message *)*ppvVar12,field_00);
LAB_002988c5:
        *(uint32 *)this_00 = uVar6;
        break;
      case 9:
        this_00 = (string *)operator_new(0x20);
        *(string **)this_00 = this_00 + 0x10;
        *(undefined8 *)(this_00 + 8) = 0;
        this_00[0x10] = (string)0x0;
        Reflection::GetString_abi_cxx11_((string *)local_90,this_01,(Message *)*ppvVar12,field_00);
        std::__cxx11::string::operator=(this_00,(string *)local_90);
        if ((string *)local_90._0_8_ != (string *)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_);
        }
        break;
      case 10:
        pMVar9 = Reflection::GetMessage(this_01,(Message *)*ppvVar12,field_00,(MessageFactory *)0x0)
        ;
        iVar5 = (*(pMVar9->super_MessageLite)._vptr_MessageLite[3])(pMVar9);
        this_00 = (string *)CONCAT44(extraout_var_01,iVar5);
        (**(code **)((long)*(double *)this_00 + 0x80))(this_00,pMVar9);
        break;
      default:
        goto switchD_002987e3_default;
      }
      pMVar8->data_ = this_00;
switchD_002987e3_default:
      MapKey::~MapKey((MapKey *)&local_58);
      ppvVar12 = ppvVar12 + 1;
      pRVar1 = (local_98->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.repeated_field_;
      pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
      ppvVar11 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar11 = (void **)0x0;
      }
    } while (ppvVar12 != ppvVar11 + (pRVar1->super_RepeatedPtrFieldBase).current_size_);
  }
  return;
}

Assistant:

void DynamicMapField::SyncMapWithRepeatedFieldNoLock() const {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des =
      default_entry_->GetDescriptor()->FindFieldByName("key");
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
       iter != map->end(); ++iter) {
    iter->second.DeleteData();
  }
  map->clear();
  for (RepeatedPtrField<Message>::iterator it =
           MapFieldBase::repeated_field_->begin();
       it != MapFieldBase::repeated_field_->end(); ++it) {
    MapKey map_key;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        map_key.SetStringValue(reflection->GetString(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        map_key.SetInt64Value(reflection->GetInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        map_key.SetInt32Value(reflection->GetInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        map_key.SetUInt64Value(reflection->GetUInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        map_key.SetUInt32Value(reflection->GetUInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        map_key.SetBoolValue(reflection->GetBool(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }

    // Remove existing map value with same key.
    Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
    if (iter != map->end()) {
      iter->second.DeleteData();
    }

    MapValueRef& map_val = (*map)[map_key];
    map_val.SetType(val_des->cpp_type());
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE, METHOD)          \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {        \
    TYPE* value = new TYPE;                         \
    *value = reflection->Get##METHOD(*it, val_des); \
    map_val.SetValue(value);                        \
    break;                                          \
  }
      HANDLE_TYPE(INT32, int32, Int32);
      HANDLE_TYPE(INT64, int64, Int64);
      HANDLE_TYPE(UINT32, uint32, UInt32);
      HANDLE_TYPE(UINT64, uint64, UInt64);
      HANDLE_TYPE(DOUBLE, double, Double);
      HANDLE_TYPE(FLOAT, float, Float);
      HANDLE_TYPE(BOOL, bool, Bool);
      HANDLE_TYPE(STRING, std::string, String);
      HANDLE_TYPE(ENUM, int32, EnumValue);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = reflection->GetMessage(*it, val_des);
        Message* value = message.New();
        value->CopyFrom(message);
        map_val.SetValue(value);
        break;
      }
    }
  }
}